

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O3

void __thiscall spdlog::details::backtracer::push_back(backtracer *this,log_msg *msg)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  log_msg_buffer *plVar4;
  byte bVar5;
  log_msg_buffer local_198;
  
  bVar5 = 0;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    plVar4 = &local_198;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(char **)plVar4 = (msg->logger_name).data_;
      msg = (log_msg *)((long)msg + (ulong)bVar5 * -0x10 + 8);
      plVar4 = (log_msg_buffer *)((long)plVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    }
    local_198.buffer.super_buffer<char>.size_ = 0;
    local_198.buffer.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0044b2f0;
    pcVar1 = local_198.buffer.store_;
    local_198.buffer.super_buffer<char>.capacity_ = 0xfa;
    local_198.buffer.super_buffer<char>.ptr_ = pcVar1;
    ::fmt::v9::detail::buffer<char>::append<char>
              (&local_198.buffer.super_buffer<char>,local_198.super_log_msg.logger_name.data_,
               local_198.super_log_msg.logger_name.data_ + local_198.super_log_msg.logger_name.size_
              );
    ::fmt::v9::detail::buffer<char>::append<char>
              (&local_198.buffer.super_buffer<char>,local_198.super_log_msg.payload.data_,
               local_198.super_log_msg.payload.data_ + local_198.super_log_msg.payload.size_);
    local_198.super_log_msg.logger_name.data_ = local_198.buffer.super_buffer<char>.ptr_;
    local_198.super_log_msg.payload.data_ =
         local_198.buffer.super_buffer<char>.ptr_ + local_198.super_log_msg.logger_name.size_;
    circular_q<spdlog::details::log_msg_buffer>::push_back(&this->messages_,&local_198);
    if (local_198.buffer.super_buffer<char>.ptr_ != pcVar1) {
      operator_delete(local_198.buffer.super_buffer<char>.ptr_,
                      local_198.buffer.super_buffer<char>.capacity_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

SPDLOG_INLINE void backtracer::push_back(const log_msg &msg) {
    std::lock_guard<std::mutex> lock{mutex_};
    messages_.push_back(log_msg_buffer{msg});
}